

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_tv_bf(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint *in_RCX;
  double *in_RDX;
  uint *in_RSI;
  CTSize shift;
  uint32_t val;
  CTSize bsz;
  CTSize pos;
  CTInfo info;
  ErrMsg in_stack_ffffffffffffffac;
  lua_State *in_stack_ffffffffffffffb0;
  uint local_40;
  
  uVar1 = *in_RSI;
  uVar3 = uVar1 >> 0x10 & 0x7f;
  if (uVar3 == 1) {
    local_40 = (uint)(byte)*in_RCX;
  }
  else if (uVar3 == 2) {
    local_40 = (uint)(ushort)*in_RCX;
  }
  else if (uVar3 == 4) {
    local_40 = *in_RCX;
  }
  else {
    local_40 = 0;
  }
  uVar3 = uVar1 >> 8 & 0x7f;
  if ((uVar1 & 0x7f) + uVar3 <= (uVar1 >> 0x10 & 0x7f) << 3) {
    bVar4 = (byte)(uVar1 & 0x7f);
    if ((uVar1 & 0x8000000) == 0) {
      bVar2 = 0x20 - (char)uVar3;
      if ((uVar1 & 0x800000) == 0) {
        *in_RDX = (double)((int)(local_40 << (bVar2 - bVar4 & 0x1f)) >> (bVar2 & 0x1f));
      }
      else {
        *in_RDX = (double)((local_40 << (bVar2 - bVar4 & 0x1f)) >> (bVar2 & 0x1f));
      }
    }
    else {
      *(uint *)((long)in_RDX + 4) = -2 - (local_40 >> (bVar4 & 0x1f) & 1);
    }
    return 0;
  }
  lj_err_caller(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
}

Assistant:

int lj_cconv_tv_bf(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTInfo info = s->info;
  CTSize pos, bsz;
  uint32_t val;
  lua_assert(ctype_isbitfield(info));
  /* NYI: packed bitfields may cause misaligned reads. */
  switch (ctype_bitcsz(info)) {
  case 4: val = *(uint32_t *)sp; break;
  case 2: val = *(uint16_t *)sp; break;
  case 1: val = *(uint8_t *)sp; break;
  default: lua_assert(0); val = 0; break;
  }
  /* Check if a packed bitfield crosses a container boundary. */
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lua_assert(pos < 8*ctype_bitcsz(info));
  lua_assert(bsz > 0 && bsz <= 8*ctype_bitcsz(info));
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  if (!(info & CTF_BOOL)) {
    CTSize shift = 32 - bsz;
    if (!(info & CTF_UNSIGNED)) {
      setintV(o, (int32_t)(val << (shift-pos)) >> shift);
    } else {
      val = (val << (shift-pos)) >> shift;
      if (!LJ_DUALNUM || (int32_t)val < 0)
	setnumV(o, (lua_Number)(uint32_t)val);
      else
	setintV(o, (int32_t)val);
    }
  } else {
    lua_assert(bsz == 1);
    setboolV(o, (val >> pos) & 1);
  }
  return 0;  /* No GC step needed. */
}